

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O3

IndexStorageInfo *
duckdb::IndexStorageInfo::Deserialize
          (IndexStorageInfo *__return_storage_ptr__,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 local_b8 [64];
  vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_> local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  idx_t iVar3;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->options)._M_h._M_buckets =
       &(__return_storage_ptr__->options)._M_h._M_single_bucket;
  (__return_storage_ptr__->options)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->options)._M_h._M_element_count = 0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->root_block_ptr).block_id = -1;
  (__return_storage_ptr__->root_block_ptr).offset = 0;
  (__return_storage_ptr__->root_block_ptr).unused_padding = 0;
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"name");
  if ((char)uVar1 == '\0') {
    local_b8._8_8_ = (pointer)0x0;
    local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
    local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_b8);
    if ((pointer)local_b8._0_8_ == (pointer)(local_b8 + 0x10)) goto LAB_0175f871;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_b8,deserializer);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_b8);
    if ((pointer)local_b8._0_8_ == (pointer)(local_b8 + 0x10)) goto LAB_0175f871;
  }
  operator_delete((void *)local_b8._0_8_);
LAB_0175f871:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"root");
  if ((char)uVar1 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar3 = CONCAT44(extraout_var,iVar2);
  }
  __return_storage_ptr__->root = iVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"allocator_infos");
  if ((char)uVar1 == '\0') {
    local_b8._16_8_ =
         (__return_storage_ptr__->allocator_infos).
         super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         .
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8._0_8_ =
         (__return_storage_ptr__->allocator_infos).
         super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         .
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8._8_8_ =
         (__return_storage_ptr__->allocator_infos).
         super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         .
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->allocator_infos).
    super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
    super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->allocator_infos).
    super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
    super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->allocator_infos).
    super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
    super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::FixedSizeAllocatorInfo,true>>
              ((type *)&local_78,deserializer);
    local_b8._16_8_ =
         (__return_storage_ptr__->allocator_infos).
         super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         .
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->allocator_infos).
    super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
    super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8._0_8_ =
         (__return_storage_ptr__->allocator_infos).
         super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         .
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8._8_8_ =
         (__return_storage_ptr__->allocator_infos).
         super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         .
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->allocator_infos).
    super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
    super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->allocator_infos).
    super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
    super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_78.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
  ~vector((vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_> *
          )local_b8);
  ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
  ~vector(&local_78);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._4_4_ = 0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"options");
  if ((char)uVar1 == '\0') {
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(__return_storage_ptr__->options)._M_h,&local_60);
  }
  else {
    Deserializer::
    Read<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              ((type *)local_b8,deserializer);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(__return_storage_ptr__->options)._M_h,local_b8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_b8);
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60);
  return __return_storage_ptr__;
}

Assistant:

IndexStorageInfo IndexStorageInfo::Deserialize(Deserializer &deserializer) {
	IndexStorageInfo result;
	deserializer.ReadPropertyWithDefault<string>(100, "name", result.name);
	deserializer.ReadPropertyWithDefault<idx_t>(101, "root", result.root);
	deserializer.ReadPropertyWithDefault<vector<FixedSizeAllocatorInfo>>(102, "allocator_infos", result.allocator_infos);
	deserializer.ReadPropertyWithExplicitDefault<case_insensitive_map_t<Value>>(103, "options", result.options, case_insensitive_map_t<Value>());
	return result;
}